

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

_Bool ra_overwrite(roaring_array_t *source,roaring_array_t *dest,_Bool copy_on_write)

{
  uint8_t *puVar1;
  long *plVar2;
  _Bool _Var3;
  long *plVar4;
  container_t *pcVar5;
  long lVar6;
  int32_t new_capacity;
  void **ppvVar7;
  long lVar8;
  
  ra_clear_containers(dest);
  new_capacity = source->size;
  if (new_capacity == 0) {
    dest->size = 0;
  }
  else {
    if (dest->allocation_size < new_capacity) {
      _Var3 = realloc_array(dest,new_capacity);
      if (!_Var3) {
        return false;
      }
      new_capacity = source->size;
    }
    dest->size = new_capacity;
    memcpy(dest->keys,source->keys,(long)new_capacity * 2);
    if (!copy_on_write) {
      memcpy(dest->typecodes,source->typecodes,(long)dest->size);
      if (dest->size < 1) {
        return true;
      }
      lVar6 = 0;
      do {
        pcVar5 = container_clone(source->containers[lVar6],source->typecodes[lVar6]);
        dest->containers[lVar6] = pcVar5;
        ppvVar7 = dest->containers;
        if (ppvVar7[lVar6] == (void *)0x0) {
          if (lVar6 != 0) {
            lVar8 = 0;
            do {
              container_free(dest->containers[lVar8],dest->typecodes[lVar8]);
              lVar8 = lVar8 + 1;
            } while (lVar6 != lVar8);
            ppvVar7 = dest->containers;
          }
          (*global_memory_hook.free)(ppvVar7);
          dest->keys = (uint16_t *)0x0;
          dest->typecodes = (uint8_t *)0x0;
          dest->size = 0;
          dest->allocation_size = 0;
          dest->containers = (void **)0x0;
          return false;
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 < dest->size);
      return true;
    }
    lVar6 = (long)dest->size;
    if (0 < lVar6) {
      lVar8 = 0;
      do {
        puVar1 = source->typecodes;
        plVar2 = (long *)source->containers[lVar8];
        if (puVar1[lVar8] == '\x04') {
          LOCK();
          *(int *)((long)plVar2 + 0xc) = *(int *)((long)plVar2 + 0xc) + 1;
          UNLOCK();
          plVar4 = plVar2;
        }
        else {
          plVar4 = (long *)(*global_memory_hook.malloc)(0x10);
          if (plVar4 == (long *)0x0) {
            plVar4 = (long *)0x0;
          }
          else {
            *plVar4 = (long)plVar2;
            *(uint8_t *)(plVar4 + 1) = puVar1[lVar8];
            LOCK();
            *(undefined4 *)((long)plVar4 + 0xc) = 2;
            UNLOCK();
            puVar1[lVar8] = '\x04';
          }
        }
        source->containers[lVar8] = plVar4;
        lVar8 = lVar8 + 1;
        lVar6 = (long)dest->size;
      } while (lVar8 < lVar6);
    }
    memcpy(dest->containers,source->containers,lVar6 << 3);
    memcpy(dest->typecodes,source->typecodes,(long)dest->size);
  }
  return true;
}

Assistant:

bool ra_overwrite(const roaring_array_t *source, roaring_array_t *dest,
                  bool copy_on_write) {
    ra_clear_containers(dest);  // we are going to overwrite them
    if (source->size == 0) {    // Note: can't call memcpy(NULL), even w/size
        dest->size = 0;         // <--- This is important.
        return true;            // output was just cleared, so they match
    }
    if (dest->allocation_size < source->size) {
        if (!realloc_array(dest, source->size)) {
            return false;
        }
    }
    dest->size = source->size;
    memcpy(dest->keys, source->keys, dest->size * sizeof(uint16_t));
    // we go through the containers, turning them into shared containers...
    if (copy_on_write) {
        for (int32_t i = 0; i < dest->size; ++i) {
            source->containers[i] = get_copy_of_container(
                source->containers[i], &source->typecodes[i], copy_on_write);
        }
        // we do a shallow copy to the other bitmap
        memcpy(dest->containers, source->containers,
               dest->size * sizeof(container_t *));
        memcpy(dest->typecodes, source->typecodes,
               dest->size * sizeof(uint8_t));
    } else {
        memcpy(dest->typecodes, source->typecodes,
               dest->size * sizeof(uint8_t));
        for (int32_t i = 0; i < dest->size; i++) {
            dest->containers[i] =
                container_clone(source->containers[i], source->typecodes[i]);
            if (dest->containers[i] == NULL) {
                for (int32_t j = 0; j < i; j++) {
                    container_free(dest->containers[j], dest->typecodes[j]);
                }
                ra_clear_without_containers(dest);
                return false;
            }
        }
    }
    return true;
}